

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GeneratingInstance.cpp
# Opt level: O3

void __thiscall GeneratingInstance::Build(GeneratingInstance *this,Instance *instance)

{
  pointer *ppTVar1;
  Task *pTVar2;
  iterator __position;
  Task TVar3;
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  int iVar7;
  int iVar8;
  int iVar9;
  int iVar10;
  pointer pTVar11;
  ulong uVar12;
  long lVar13;
  int iVar14;
  long lVar15;
  int iVar16;
  pointer pTVar17;
  int iVar18;
  pointer pTVar19;
  ulong uVar20;
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  Task local_38;
  
  iVar7 = rand();
  iVar8 = iVar7 % 0x61 + 3;
  iVar9 = rand();
  if (-3 < iVar7 % 0x61) {
    iVar16 = (iVar9 % 0x28 + 10) * iVar8;
    iVar7 = 0;
    iVar9 = 0;
    do {
      if (0 < iVar16) {
        iVar14 = 0;
        do {
          iVar10 = rand();
          iVar18 = iVar16 - iVar14;
          if (iVar10 % 1000 + iVar14 + 3 <= iVar16) {
            iVar18 = iVar10 % 1000 + 3;
          }
          __position._M_current =
               (instance->tasks).super__Vector_base<Task,_std::allocator<Task>_>._M_impl.
               super__Vector_impl_data._M_finish;
          local_38.length = iVar18;
          local_38.id = iVar7;
          if (__position._M_current ==
              (instance->tasks).super__Vector_base<Task,_std::allocator<Task>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage) {
            std::vector<Task,_std::allocator<Task>_>::_M_realloc_insert<Task>
                      (&instance->tasks,__position,&local_38);
          }
          else {
            TVar3.id = iVar7;
            TVar3.length = iVar18;
            *__position._M_current = TVar3;
            ppTVar1 = &(instance->tasks).super__Vector_base<Task,_std::allocator<Task>_>._M_impl.
                       super__Vector_impl_data._M_finish;
            *ppTVar1 = *ppTVar1 + 1;
          }
          iVar7 = iVar7 + 1;
          iVar14 = iVar18 + iVar14;
        } while (iVar14 < iVar16);
      }
      iVar9 = iVar9 + 1;
    } while (iVar9 != iVar8);
  }
  pTVar17 = (instance->tasks).super__Vector_base<Task,_std::allocator<Task>_>._M_impl.
            super__Vector_impl_data._M_start;
  pTVar19 = (instance->tasks).super__Vector_base<Task,_std::allocator<Task>_>._M_impl.
            super__Vector_impl_data._M_finish;
  if (pTVar17 != pTVar19) {
    if (pTVar17 + 1 != pTVar19) {
      lVar15 = 8;
      do {
        iVar7 = rand();
        lVar13 = (long)iVar7 % ((lVar15 >> 3) + 1);
        if (lVar15 != lVar13 * 8) {
          pTVar2 = (Task *)((long)&pTVar17->length + lVar15);
          TVar3 = *pTVar2;
          *pTVar2 = pTVar17[lVar13];
          pTVar17[lVar13] = TVar3;
        }
        pTVar11 = (pointer)((long)&pTVar17[1].length + lVar15);
        lVar15 = lVar15 + 8;
      } while (pTVar11 != pTVar19);
      pTVar17 = (instance->tasks).super__Vector_base<Task,_std::allocator<Task>_>._M_impl.
                super__Vector_impl_data._M_start;
      pTVar19 = (instance->tasks).super__Vector_base<Task,_std::allocator<Task>_>._M_impl.
                super__Vector_impl_data._M_finish;
    }
    auVar6 = _DAT_00107070;
    auVar5 = _DAT_00107060;
    auVar4 = _DAT_00107050;
    if (pTVar17 != pTVar19) {
      uVar20 = (long)pTVar19 + (-8 - (long)pTVar17);
      auVar23._8_4_ = (int)uVar20;
      auVar23._0_8_ = uVar20;
      auVar23._12_4_ = (int)(uVar20 >> 0x20);
      auVar21._0_8_ = uVar20 >> 3;
      auVar21._8_8_ = auVar23._8_8_ >> 3;
      uVar12 = 0;
      auVar21 = auVar21 ^ _DAT_00107070;
      do {
        iVar9 = (int)uVar12;
        auVar22._8_4_ = iVar9;
        auVar22._0_8_ = uVar12;
        auVar22._12_4_ = (int)(uVar12 >> 0x20);
        auVar23 = (auVar22 | auVar5) ^ auVar6;
        iVar7 = auVar21._4_4_;
        if ((bool)(~(auVar23._4_4_ == iVar7 && auVar21._0_4_ < auVar23._0_4_ ||
                    iVar7 < auVar23._4_4_) & 1)) {
          pTVar17[uVar12].id = iVar9;
        }
        if ((auVar23._12_4_ != auVar21._12_4_ || auVar23._8_4_ <= auVar21._8_4_) &&
            auVar23._12_4_ <= auVar21._12_4_) {
          pTVar17[uVar12 + 1].id = iVar9 + 1;
        }
        auVar23 = (auVar22 | auVar4) ^ auVar6;
        iVar16 = auVar23._4_4_;
        if (iVar16 <= iVar7 && (iVar16 != iVar7 || auVar23._0_4_ <= auVar21._0_4_)) {
          pTVar17[uVar12 + 2].id = iVar9 + 2;
          pTVar17[uVar12 + 3].id = iVar9 + 3;
        }
        uVar12 = uVar12 + 4;
      } while (((uVar20 >> 3) + 4 & 0xfffffffffffffffc) != uVar12);
    }
  }
  instance->numProcessors = iVar8;
  return;
}

Assistant:

void GeneratingInstance::Build(Instance& instance){
	int numberOfCores = rand() % 97 + 3;
	int numberOfTaksSoFar = 0;
	int optimalProcessingTime = numberOfCores * (rand() %40 + 10);
	//Randomly generate Instance's optimum

	for(int i = 0; i < numberOfCores; i++){
		//For every core, generate a random number of tasks, which lengths (also random) when added equal optimum
		int coreLengthSoFar = 0;
		while(coreLengthSoFar<optimalProcessingTime){
			int newTaskLength = rand() %1000 + 3;
			if(coreLengthSoFar + newTaskLength > optimalProcessingTime)
			//Check if newTaskLength does not overload core (aka does not increase optimal processing time), if so trim new TaskLength, so it fits
				newTaskLength = optimalProcessingTime - coreLengthSoFar;

			instance.tasks.push_back(Task(newTaskLength, numberOfTaksSoFar));
			numberOfTaksSoFar++;
			coreLengthSoFar += newTaskLength;
		}
	}

	std::random_shuffle(instance.tasks.begin(), instance.tasks.end());
	//reshuffle for even more random result
	
	int i = 0;
	for(auto& task : instance.tasks){
		task.setId(i);
		i++;
	}

	instance.numProcessors = numberOfCores;
}